

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void simd::Accumulate(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
                     vector<unsigned_int,_std::allocator<unsigned_int>_> *result,SIMDType simdType)

{
  byte bVar1;
  uint32_t rowSize;
  uint32_t *outY;
  uint32_t uVar2;
  uint uVar3;
  imageException *this;
  uint32_t uVar4;
  uint uVar5;
  uint8_t *imageY;
  bool bVar6;
  
  uVar2 = getSimdSize(simdType);
  if ((simdType != cpu_function) &&
     (bVar1 = image->_colorCount, uVar2 <= height * width * (uint)bVar1)) {
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              (image,x,y,width,height);
    Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
    outY = (result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
    uVar5 = width * bVar1;
    if ((long)(result->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)outY >> 2 != (ulong)(uVar5 * height)) {
      this = (imageException *)__cxa_allocate_exception(0x28);
      imageException::imageException
                (this,"Array size is not equal to image ROI (width * height) size");
      __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
    }
    rowSize = image->_rowSize;
    uVar4 = height;
    if (rowSize == uVar5) {
      bVar6 = 0xffffffff / height <= uVar5;
      uVar3 = uVar5 * height;
      if (bVar6) {
        uVar3 = uVar5;
      }
      uVar5 = uVar3;
      uVar4 = 1;
      if (bVar6) {
        uVar4 = height;
      }
    }
    uVar3 = uVar5 / uVar2;
    imageY = image->_data + (ulong)(bVar1 * x) + (ulong)(y * rowSize);
    if (simdType == sse_function) {
      sse::Accumulate(rowSize,imageY,imageY + uVar4 * rowSize,outY,uVar3,uVar2 * uVar3,uVar5 % uVar2
                     );
    }
    else if (simdType == avx_function) {
      avx::Accumulate(rowSize,imageY,imageY + uVar4 * rowSize,outY,uVar3,uVar2 * uVar3,uVar5 % uVar2
                     );
    }
    return;
  }
  Image_Function::Accumulate(image,x,y,width,height,result);
  return;
}

Assistant:

void Accumulate( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector<uint32_t> & result, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );
        const uint8_t colorCount = image.colorCount();

        if( (simdType == cpu_function) || ((width * height * colorCount) < simdSize) ) {
            Image_Function::Accumulate(image, x, y, width, height, result);
            return;
        }

        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );
        width = width * colorCount;

        if( result.size() != width * height )
            throw imageException( "Array size is not equal to image ROI (width * height) size" );

        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x * colorCount;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        uint32_t * outY = result.data();

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Accumulate( rowSize, imageY, imageYEnd, outY, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Accumulate( rowSize, imageY, imageYEnd, outY, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Accumulate( rowSize, imageY, imageYEnd, outY, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }